

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressionValidator.cpp
# Opt level: O2

Result * CoreML::validateSchemaTypesIsMultiArray
                   (Result *__return_storage_ptr__,FeatureDescription *featureDesc,
                   ArrayFeatureType_ArrayDataType allowedArrayFeatureDataType,int shapeSizeMin,
                   int shapeSizeMax)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined1 *puVar4;
  string sStack_1d8;
  stringstream out;
  ostream local_1a8 [376];
  
  puVar4 = (undefined1 *)featureDesc->type_;
  if ((FeatureType *)puVar4 == (FeatureType *)0x0) {
    puVar4 = Specification::_FeatureType_default_instance_;
  }
  if (((FeatureType *)puVar4)->_oneof_case_[0] == 5) {
    if (((((FeatureType *)puVar4)->Type_).multiarraytype_)->datatype_ == allowedArrayFeatureDataType
       ) {
      iVar1 = (((((FeatureType *)puVar4)->Type_).multiarraytype_)->shape_).current_size_;
      if (shapeSizeMin <= iVar1 && iVar1 <= shapeSizeMax) {
        Result::Result(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&out);
      poVar2 = std::operator<<(local_1a8,"Unsupported array rank ");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
      poVar2 = std::operator<<(poVar2," should be in range [");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,shapeSizeMin);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,shapeSizeMax);
      poVar2 = std::operator<<(poVar2,"]");
      poVar2 = std::operator<<(poVar2,".");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::stringbuf::str();
      Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&sStack_1d8);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&out);
      poVar2 = std::operator<<(local_1a8,"Unsupported array type \"");
      if (((FeatureType *)puVar4)->_oneof_case_[0] == 5) {
        puVar4 = (undefined1 *)(((FeatureType *)puVar4)->Type_).sequencetype_;
      }
      else {
        puVar4 = Specification::_ArrayFeatureType_default_instance_;
      }
      pcVar3 = MLArrayDataType_Name(((SequenceFeatureType *)puVar4)->_oneof_case_[0]);
      poVar2 = std::operator<<(poVar2,pcVar3);
      poVar2 = std::operator<<(poVar2,"\" for feature \"");
      std::operator+(&sStack_1d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(featureDesc->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),"\". ");
      poVar2 = std::operator<<(poVar2,(string *)&sStack_1d8);
      poVar2 = std::operator<<(poVar2,"Should be of: ");
      pcVar3 = MLArrayDataType_Name(allowedArrayFeatureDataType);
      poVar2 = std::operator<<(poVar2,pcVar3);
      poVar2 = std::operator<<(poVar2,".");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&sStack_1d8);
      std::__cxx11::stringbuf::str();
      Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&sStack_1d8);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&out);
    poVar2 = std::operator<<(local_1a8,"Unsupported type \"");
    puVar4 = (undefined1 *)featureDesc->type_;
    if ((FeatureType *)puVar4 == (FeatureType *)0x0) {
      puVar4 = Specification::_FeatureType_default_instance_;
    }
    pcVar3 = ::MLFeatureTypeType_Name(((FeatureType *)puVar4)->_oneof_case_[0]);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"\" for feature \"");
    std::operator+(&sStack_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(featureDesc->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),"\". ");
    poVar2 = std::operator<<(poVar2,(string *)&sStack_1d8);
    poVar2 = std::operator<<(poVar2,"Should be of: ");
    poVar2 = std::operator<<(poVar2,"MLFeatureTypeType_multiArrayType");
    poVar2 = std::operator<<(poVar2," with data type of: ");
    pcVar3 = MLArrayDataType_Name(allowedArrayFeatureDataType);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,".");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&sStack_1d8);
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&sStack_1d8);
  }
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateSchemaTypesIsMultiArray(const Specification::FeatureDescription& featureDesc,
                                           Specification::ArrayFeatureType_ArrayDataType allowedArrayFeatureDataType,
                                           int shapeSizeMin = 1,
                                           int shapeSizeMax = INT_MAX) {
        // Check the types
        auto& type = featureDesc.type();
        if (!type.has_multiarraytype() || type.Type_case() != Specification::FeatureType::kMultiArrayType) {
            // Invalid type
            std::stringstream out;
            out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(featureDesc.type().Type_case()))
            << "\" for feature \"" << featureDesc.name() + "\". "
            << "Should be of: " << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::FeatureType::kMultiArrayType))
            << " with data type of: " << MLArrayDataType_Name(static_cast<MLArrayDataType>(allowedArrayFeatureDataType))
            << "." << std::endl;
            return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
        }

        if (type.multiarraytype().datatype() != allowedArrayFeatureDataType) {
            std::stringstream out;
            out << "Unsupported array type \"" << MLArrayDataType_Name(static_cast<MLArrayDataType>(type.multiarraytype().datatype()))
            << "\" for feature \"" << featureDesc.name() + "\". "
            << "Should be of: " << MLArrayDataType_Name(static_cast<MLArrayDataType>(allowedArrayFeatureDataType))
            << "." << std::endl;
            return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
        }

        int shapeSize = type.multiarraytype().shape_size();
        if (shapeSize<shapeSizeMin || shapeSizeMax < shapeSize) {
            std::stringstream out;
            out << "Unsupported array rank " << shapeSize
            << " should be in range [" << shapeSizeMin << "," << shapeSizeMax << "]"
            << "." << std::endl;
            return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
        }

        // no invariant broken -- type matches one of the allowed types
        return Result();
    }